

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

Var __thiscall
Js::InterpreterStackFrame::
OP_LdEnvSlot<Js::OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
          *playout)

{
  byte bVar1;
  long lVar2;
  ulong *puVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  undefined4 *puVar8;
  long lVar9;
  
  uVar7 = (ulong)(playout->super_OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
                 SlotIndex1;
  uVar6 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(this + 0x88));
  lVar2 = *(long *)(this + 0x88);
  lVar9 = *(long *)(lVar2 + 0x10);
  if (lVar9 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) goto LAB_00a60b46;
    *puVar8 = 0;
    lVar9 = *(long *)(lVar2 + 0x10);
  }
  bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,ClosureRangeCheckPhase,uVar6,
                            *(LocalFunctionId *)(lVar9 + 0x10));
  if ((bVar5) || (uVar7 - 1 < (ulong)*(ushort *)((long)instance + 2))) {
    puVar3 = *(ulong **)((long)instance + uVar7 * 8);
    bVar1 = (playout->super_OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
            SlotIndex2;
    uVar6 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(this + 0x88));
    lVar2 = *(long *)(this + 0x88);
    lVar9 = *(long *)(lVar2 + 0x10);
    if (lVar9 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) {
LAB_00a60b46:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
      lVar9 = *(long *)(lVar2 + 0x10);
    }
    bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,ClosureRangeCheckPhase,uVar6,
                              *(LocalFunctionId *)(lVar9 + 0x10));
    if ((bVar5) || ((ulong)(bVar1 - 2) < *puVar3)) {
      return (Var)puVar3[bVar1];
    }
  }
  Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

Var InterpreterStackFrame::OP_LdEnvSlot(Var instance, const unaligned T* playout)
    {
        Var slotArray = OP_LdFrameDisplaySlot(instance, playout->SlotIndex1);
        return OP_LdSlot(slotArray, playout->SlotIndex2);
    }